

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.h
# Opt level: O3

void __thiscall TiXmlDeclaration::~TiXmlDeclaration(TiXmlDeclaration *this)

{
  Rep *pRVar1;
  
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlDeclaration_002168f8;
  pRVar1 = (this->standalone).rep_;
  if (pRVar1 != (Rep *)0x0 && pRVar1 != &TiXmlString::nullrep_) {
    operator_delete__(pRVar1);
  }
  pRVar1 = (this->encoding).rep_;
  if (pRVar1 != (Rep *)0x0 && pRVar1 != &TiXmlString::nullrep_) {
    operator_delete__(pRVar1);
  }
  pRVar1 = (this->version).rep_;
  if (pRVar1 != (Rep *)0x0 && pRVar1 != &TiXmlString::nullrep_) {
    operator_delete__(pRVar1);
  }
  TiXmlNode::~TiXmlNode(&this->super_TiXmlNode);
  return;
}

Assistant:

virtual ~TiXmlDeclaration()	{}